

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O3

MPP_RET hal_vp8e_setup(void *hal)

{
  undefined8 *puVar1;
  MppFrameFormat format;
  MppBufferGroup *group;
  ulong uVar2;
  bool bVar3;
  undefined2 uVar4;
  RK_U32 RVar5;
  MPP_RET MVar6;
  long lVar7;
  undefined1 *puVar8;
  void *pvVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined8 uVar21;
  VepuFormatCfg fmt_cfg;
  undefined8 local_68;
  VepuFormatCfg local_4c;
  ulong local_40;
  long local_38;
  
  lVar7 = *(long *)((long)hal + 0x70);
  uVar19 = *(uint *)(lVar7 + 0xc);
  uVar11 = *(uint *)(lVar7 + 0x10);
  if (*(int *)(lVar7 + 0x58) != 0) {
    _mpp_log_l(2,"hal_vp8e_base","Warning: do not support mirroring\n","set_parameter");
  }
  uVar14 = uVar19 + 0xf & 0xfffffff0;
  uVar20 = uVar11 + 0xf & 0xfffffff0;
  iVar10 = *(int *)(lVar7 + 0x50);
  if (iVar10 == 0) {
LAB_0026a488:
    local_68._0_4_ = 0;
    uVar18 = uVar19;
    uVar15 = uVar14;
    uVar14 = uVar20;
    uVar19 = uVar11;
  }
  else {
    uVar18 = uVar11;
    uVar15 = uVar20;
    if (iVar10 == 1) {
      local_68._0_4_ = 1;
    }
    else {
      if (iVar10 != 3) {
        _mpp_log_l(2,"hal_vp8e_base",
                   "Warning: only support 90 or 270 degree rotate, request rotate %d",
                   "set_parameter",0);
        goto LAB_0026a488;
      }
      local_68._0_4_ = 2;
    }
  }
  RVar5 = get_vepu_pixel_stride
                    ((VepuStrideCfg *)((long)hal + 0x6934),uVar18,*(RK_U32 *)(lVar7 + 0x14),
                     *(MppFrameFormat *)(lVar7 + 0x24));
  iVar10 = (int)uVar15 >> 4;
  *(int *)((long)hal + 0x6928) = (int)(iVar10 * uVar14) >> 4;
  *(int *)((long)hal + 0x692c) = iVar10;
  iVar12 = (int)uVar14 >> 4;
  *(int *)((long)hal + 0x6930) = iVar12;
  *(uint *)((long)hal + 0x80) = uVar15;
  *(uint *)((long)hal + 0x84) = uVar14;
  *(int *)((long)hal + 0x78) = iVar10;
  *(int *)((long)hal + 0x7c) = iVar12;
  *(undefined8 *)((long)hal + 0x88) = 0;
  *(undefined8 *)((long)hal + 0x90) = 0;
  *(undefined4 *)((long)hal + 0x98) = 0;
  *(undefined8 *)((long)hal + 0x9c) = 0x100000003;
  *(undefined8 *)((long)hal + 0xa4) = 0;
  *(undefined4 *)((long)hal + 0xac) = 0;
  *(undefined4 *)((long)hal + 200) = 1;
  *(undefined8 *)((long)hal + 0xb0) = 0x100000001;
  *(undefined4 *)((long)hal + 0x110) = 1;
  *(undefined8 *)((long)hal + 0xc0) = 0x100000000;
  *(undefined8 *)((long)hal + 0xb8) = 0;
  *(undefined1 *)((long)hal + 0xcc) = 1;
  *(undefined8 *)((long)hal + 0xf0) = 0;
  *(undefined8 *)((long)hal + 0xf8) = 0;
  *(undefined8 *)((long)hal + 0xd0) = 0;
  *(undefined8 *)((long)hal + 0xd8) = 0;
  *(undefined4 *)((long)hal + 400) = (undefined4)local_68;
  format = *(MppFrameFormat *)(lVar7 + 0x24);
  if ((format & ~MPP_FMT_YUV420P) == MPP_FMT_YUV420SP) {
    *(undefined4 *)((long)hal + 0x2f8) = 0;
LAB_0026a587:
    *(undefined4 *)((long)hal + 0x2fc) = 0;
  }
  else {
    *(undefined4 *)((long)hal + 0x2f8) = 0;
    if (format - MPP_FMT_RGB565 < 6) goto LAB_0026a587;
  }
  *(int *)((long)hal + 0x168) = iVar10;
  *(int *)((long)hal + 0x164) = iVar12;
  *(RK_U32 *)((long)hal + 0x178) = RVar5;
  uVar11 = 0x10 - (uVar18 & 0xf) >> 2;
  if ((uVar18 & 0xf) == 0) {
    uVar11 = 0;
  }
  *(uint *)((long)hal + 0x17c) = uVar11;
  iVar10 = 0x10 - (uVar19 & 0xf);
  if ((uVar19 & 0xf) == 0) {
    iVar10 = 0;
  }
  *(int *)((long)hal + 0x180) = iVar10;
  *(undefined4 *)((long)hal + 0x308) = 0;
  uVar4 = 0xb694;
  if (*(int *)(lVar7 + 0x28) == 1) {
    uVar4 = 0xa28f;
    uVar21 = 0x89f502dcb717366d;
  }
  else {
    uVar21 = 0x90901d50962b4c85;
  }
  *(undefined8 *)((long)hal + 900) = uVar21;
  *(undefined2 *)((long)hal + 0x38c) = uVar4;
  *(undefined1 *)((long)hal + 0x390) = 0;
  *(undefined2 *)((long)hal + 0x38e) = 0;
  MVar6 = get_vepu_fmt(&local_4c,format);
  if (MVar6 != MPP_OK) {
    _mpp_log_l(2,"hal_vp8e_base","set vp8e parameter failed",(char *)0x0);
    return MPP_NOK;
  }
  *(VepuFmt *)((long)hal + 0x18c) = local_4c.format;
  *(RK_U8 *)((long)hal + 0x38e) = local_4c.r_mask;
  *(RK_U8 *)((long)hal + 0x38f) = local_4c.g_mask;
  *(RK_U8 *)((long)hal + 0x390) = local_4c.b_mask;
  iVar10 = (int)*(undefined8 *)((long)hal + 0x78);
  iVar12 = (int)((ulong)*(undefined8 *)((long)hal + 0x78) >> 0x20);
  local_68 = CONCAT44(iVar12 << 4,iVar10 << 4);
  memset((void *)((long)hal + 0x3660),0,0x188);
  lVar7 = 0x3674;
  do {
    puVar1 = (undefined8 *)((long)hal + lVar7 + -0x14);
    *puVar1 = local_68;
    puVar1[1] = CONCAT44(iVar12 * 8,iVar10 * 8);
    *(undefined8 *)((long)hal + lVar7 + -4) = 0;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0x3754);
  *(void **)((long)hal + 0x37e8) = (void *)((long)hal + 0x3660);
  *(undefined4 *)((long)hal + 0x120) = 1;
  puVar8 = (undefined1 *)mpp_osal_calloc("set_picbuf",0x3c);
  *(undefined1 **)((long)hal + 0x118) = puVar8;
  if (puVar8 == (undefined1 *)0x0) {
    _mpp_log_l(2,"hal_vp8e_base","failed to malloc ppss store.\n",(char *)0x0);
    _mpp_log_l(2,"hal_vp8e_base","set vp8e picbuf failed, no enough memory",(char *)0x0);
    return MPP_ERR_NOMEM;
  }
  *(undefined1 **)((long)hal + 0x128) = puVar8;
  puVar8[0x18] = 0;
  *puVar8 = 0;
  group = *(MppBufferGroup **)((long)hal + 0x60);
  lVar7 = *(long *)((long)hal + 0x70);
  uVar19 = *(uint *)((long)hal + 0x6928);
  *(undefined4 *)((long)hal + 0x174) = 1;
  MVar6 = mpp_buffer_group_get
                    (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_vp8e_base","alloc_buffer");
  if (MVar6 != MPP_OK) {
    _mpp_log_l(2,"hal_vp8e_base","buf group get failed ret %d\n",(char *)0x0,(ulong)(uint)MVar6);
    if (group == (MppBufferGroup *)0x0) {
      return MVar6;
    }
    goto LAB_0026a83f;
  }
  MVar6 = mpp_buffer_get_with_tag
                    (*group,group + 3,(ulong)((uVar19 * 0x100 + 0xfff & 0xfffff000) + 0x1000),
                     "hal_vp8e_base","alloc_buffer");
  if (MVar6 == MPP_OK) {
    lVar16 = 0;
    bVar3 = true;
    local_40 = (ulong)uVar19;
    local_38 = lVar7;
    do {
      bVar17 = bVar3;
      MVar6 = mpp_buffer_get_with_tag
                        (*group,group + lVar16 + 4,
                         (ulong)((uVar19 * 0x80 + 0xfff & 0xfffff000) + 0x1000),"hal_vp8e_base",
                         "alloc_buffer");
      if (MVar6 != MPP_OK) {
        _mpp_log_l(2,"hal_vp8e_base","hw_cbcr_buf[%d] get failed ret %d\n",(char *)0x0,lVar16,
                   (ulong)(uint)MVar6);
        goto LAB_0026a83f;
      }
      lVar16 = 1;
      bVar3 = false;
    } while (bVar17);
    iVar10 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
    *(int *)((long)hal + 0x1bc) = iVar10;
    iVar10 = mpp_buffer_get_fd_with_caller(group[4],"alloc_buffer");
    *(int *)((long)hal + 0x1c0) = iVar10;
    iVar10 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
    *(int *)((long)hal + 0x1c4) = iVar10;
    iVar10 = mpp_buffer_get_fd_with_caller(group[5],"alloc_buffer");
    lVar7 = local_38;
    *(int *)((long)hal + 0x1cc) = iVar10;
    MVar6 = mpp_buffer_get_with_tag
                      (*group,group + 7,(ulong)(*(int *)(local_38 + 0x10) * 4 + 0x17U & 0xfffffff8),
                       "hal_vp8e_base","alloc_buffer");
    if (MVar6 == MPP_OK) {
      MVar6 = mpp_buffer_get_with_tag(*group,group + 6,0x4b8,"hal_vp8e_base","alloc_buffer");
      if (MVar6 != MPP_OK) {
        pcVar13 = "hw_cabac_table_buf get failed\n";
LAB_0026a9bf:
        _mpp_log_l(2,"hal_vp8e_base",pcVar13,(char *)0x0);
        goto LAB_0026a83f;
      }
      iVar10 = mpp_buffer_get_fd_with_caller(group[6],"alloc_buffer");
      uVar2 = local_40;
      *(int *)((long)hal + 0x378) = iVar10;
      uVar19 = (int)local_40 * 4;
      MVar6 = mpp_buffer_get_with_tag
                        (*group,group + 10,(ulong)uVar19,"hal_vp8e_base","alloc_buffer");
      if (MVar6 == MPP_OK) {
        iVar10 = mpp_buffer_get_fd_with_caller(group[10],"alloc_buffer");
        *(int *)((long)hal + 0x374) = iVar10;
        pvVar9 = mpp_buffer_get_ptr_with_caller(group[10],"alloc_buffer");
        memset(pvVar9,0,uVar2 << 2);
        mpp_buffer_sync_end_f(group[10],0,"alloc_buffer");
        MVar6 = mpp_buffer_get_with_tag(*group,group + 9,0x1e8,"hal_vp8e_base","alloc_buffer");
        if (MVar6 == MPP_OK) {
          iVar10 = mpp_buffer_get_fd_with_caller(group[9],"alloc_buffer");
          *(int *)((long)hal + 0x37c) = iVar10;
          uVar19 = uVar19 + 0x3f >> 3 & 0xfffffff8;
          MVar6 = mpp_buffer_get_with_tag
                            (*group,group + 8,(ulong)uVar19,"hal_vp8e_base","alloc_buffer");
          if (MVar6 == MPP_OK) {
            iVar10 = mpp_buffer_get_fd_with_caller(group[8],"alloc_buffer");
            *(int *)((long)hal + 0x380) = iVar10;
            pvVar9 = mpp_buffer_get_ptr_with_caller(group[8],"alloc_buffer");
            memset(pvVar9,0,(ulong)(uVar19 >> 2));
            mpp_buffer_sync_end_f(group[8],0,"alloc_buffer");
            *(undefined4 *)((long)hal + 0x3640) = 1;
            iVar10 = mpp_buffer_get_fd_with_caller(group[3],"alloc_buffer");
            *(int *)((long)hal + 0x3670) = iVar10;
            iVar10 = mpp_buffer_get_fd_with_caller(group[4],"alloc_buffer");
            *(int *)((long)hal + 0x3674) = iVar10;
            iVar10 = mpp_buffer_get_fd_with_caller(group[5],"alloc_buffer");
            *(int *)((long)hal + 0x36ac) = iVar10;
            iVar10 = (*(int *)(lVar7 + 0x10) + 0xfU & 0xffffff0) *
                     (*(int *)(lVar7 + 0xc) + 0xfU & 0xfffffff0);
            MVar6 = mpp_buffer_get_with_tag
                              (*group,group + 0xb,(ulong)((uint)((iVar10 >> 1) + iVar10) >> 1),
                               "hal_vp8e_base","alloc_buffer");
            if (MVar6 == MPP_OK) {
              pvVar9 = mpp_osal_calloc("alloc_buffer",(ulong)*(uint *)((long)hal + 0x68) << 2);
              *(void **)((long)hal + 0x58) = pvVar9;
              if (pvVar9 != (void *)0x0) {
                *(undefined8 *)((long)hal + 0x324) = 0xffffffffffffffff;
                *(undefined4 *)((long)hal + 0x32c) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x310) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x314) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x318) = 0xffffffff;
                *(undefined4 *)((long)hal + 0x31c) = 0xffffffff;
                *(undefined8 *)((long)hal + 0x4f4) = 0;
                *(undefined8 *)((long)hal + 0x4fc) = 0x3ff;
                *(undefined4 *)((long)hal + 0x4ec) = 0;
                *(undefined8 *)((long)hal + 0x33c) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x344) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x34c) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x354) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x35c) = 0xff000000ff;
                *(undefined8 *)((long)hal + 0x364) = 0xff000000ff;
                return MPP_OK;
              }
              pcVar13 = "failed to calloc regs.\n";
              MVar6 = MPP_OK;
              goto LAB_0026a9bf;
            }
            pcVar13 = "hw_out_buf get failed ret %d\n";
          }
          else {
            pcVar13 = "hw_segment_map_buf get failed ret %d\n";
          }
        }
        else {
          pcVar13 = "hw_prob_count_buf get failed ret %d\n";
        }
      }
      else {
        pcVar13 = "hw_mv_output_buf get failed ret %d\n";
      }
    }
    else {
      pcVar13 = "hw_size_table_buf get failed ret %d\n";
    }
  }
  else {
    pcVar13 = "hw_luma_buf get failed ret %d\n";
  }
  _mpp_log_l(2,"hal_vp8e_base",pcVar13,(char *)0x0,(ulong)(uint)MVar6);
LAB_0026a83f:
  hal_vp8e_buf_free(hal);
  return MVar6;
}

Assistant:

MPP_RET hal_vp8e_setup(void *hal)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    if (set_parameter(ctx)) {
        mpp_err("set vp8e parameter failed");
        return MPP_NOK;
    }

    if (set_picbuf(ctx)) {
        mpp_err("set vp8e picbuf failed, no enough memory");
        return MPP_ERR_NOMEM;
    }

    ret = alloc_buffer(ctx);

    return ret;
}